

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

BOOL __thiscall
Memory::Recycler::CollectWithHeuristic<(Memory::CollectionFlags)404852739>(Recycler *this)

{
  code *pcVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  uint uVar6;
  DWORD DVar7;
  undefined4 *puVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  
  if (this->inPartialCollectMode != false) {
    if (this->enablePartialCollect == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0xe8b,"(enablePartialCollect)","enablePartialCollect");
      if (!bVar3) goto LAB_007251e0;
      *puVar8 = 0;
    }
    uVar9 = this->uncollectedNewPageCountPartialCollect;
    if ((uVar9 < 0x400) || (RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount < uVar9))
    {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0xe8e,
                         "(this->uncollectedNewPageCountPartialCollect >= RecyclerSweepManager::MinPartialUncollectedNewPageCount && this->uncollectedNewPageCountPartialCollect <= RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount)"
                         ,
                         "this->uncollectedNewPageCountPartialCollect >= RecyclerSweepManager::MinPartialUncollectedNewPageCount && this->uncollectedNewPageCountPartialCollect <= RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount"
                        );
      if (!bVar3) {
LAB_007251e0:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar8 = 0;
      uVar9 = this->uncollectedNewPageCountPartialCollect;
    }
    if (uVar9 < (this->autoHeap).uncollectedNewPageCount) {
      BVar5 = Collect<(Memory::CollectionFlags)404852739>(this);
      return BVar5;
    }
  }
  uVar9 = (this->autoHeap).uncollectedAllocBytes;
  uVar6 = RecyclerHeuristic::UncollectedAllocBytesCollection();
  if (uVar6 <= uVar9) {
    uVar10 = (ulong)RecyclerHeuristic::Instance.MaxUncollectedAllocBytes;
    uVar9 = (this->autoHeap).uncollectedAllocBytes;
    DVar7 = GetTickCount();
    iVar11 = this->tickCountNextCollection - DVar7;
    (this->collectionParam).timeDiff = -iVar11;
    if (iVar11 < 0 || uVar10 <= uVar9) {
      BVar5 = Collect<(Memory::CollectionFlags)270635011>(this);
      return BVar5;
    }
  }
  (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[0x12])();
  bVar3 = this->hasDisposableObject;
  if (bVar3 == 1) {
    this->allowDispose = true;
    this->inDisposeWrapper = true;
    bVar4 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,RecyclerPhase);
    if (bVar4) {
      Output::Print(L"%04X> RC(%p): %s\n",this->mainThreadId,this,L"Process delayed dispose object")
      ;
    }
    (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[0xe])(this->collectionWrapper,this);
    if ((((this->collectionState).value == CollectionStateNotCollecting) &&
        (this->inExhaustiveCollection == true)) && ((this->hasExhaustiveCandidate & 1U) != 0)) {
      (this->collectionParam).priorityBoostConcurrentSweepOverride = false;
      (this->collectionParam).finishOnly = false;
      (this->collectionParam).repeat = true;
      (this->collectionParam).flags =
           CollectMode_Concurrent|CollectOverride_FinishConcurrentTimeout|
           CollectOverride_AllowReentrant|CollectNowDefaultLSCleanup|CollectHeuristic_Time|
           CollectHeuristic_AllocSize;
      (this->collectionParam).uncollectedAllocBytes = (this->autoHeap).uncollectedAllocBytes;
      (this->collectionParam).uncollectedNewPageCountPartialCollect =
           this->uncollectedNewPageCountPartialCollect;
      (this->collectionParam).inPartialCollectMode = this->inPartialCollectMode;
      sVar2 = (this->autoHeap).unusedPartialCollectFreeBytes;
      (this->collectionParam).uncollectedNewPageCount = (this->autoHeap).uncollectedNewPageCount;
      (this->collectionParam).unusedPartialCollectFreeBytes = sVar2;
      DoCollectWrapped(this,CollectMode_Concurrent|CollectOverride_FinishConcurrentTimeout|
                            CollectOverride_AllowReentrant|CollectNowDefaultLSCleanup|
                            CollectHeuristic_Time|CollectHeuristic_AllocSize);
    }
    this->inDisposeWrapper = false;
  }
  return (uint)bVar3;
}

Assistant:

BOOL
Recycler::CollectWithHeuristic()
{
    // CollectHeuristic_Never flag should only be used with exhaustive candidate
    Assert((flags & CollectHeuristic_Never) == 0);

    BOOL isScriptContextCloseGCPending = FALSE;
    const BOOL allocSize = flags & CollectHeuristic_AllocSize;
    const BOOL timedIfScriptActive = flags & CollectHeuristic_TimeIfScriptActive;
    const BOOL timedIfInScript = flags & CollectHeuristic_TimeIfInScript;
    const BOOL timed = (timedIfScriptActive && isScriptActive) || (timedIfInScript && isInScript) || (flags & CollectHeuristic_Time);

    if ((flags & CollectOverride_CheckScriptContextClose) != 0)
    {
        isScriptContextCloseGCPending = this->collectionWrapper->GetIsScriptContextCloseGCPending();
    }

    // If there is a script context close GC pending, we need to do a GC regardless
    // Otherwise, we should check the heuristics to see if a GC is necessary
    if (!isScriptContextCloseGCPending)
    {
#if ENABLE_PARTIAL_GC
        if (GetPartialFlag<flags>())
        {
            Assert(enablePartialCollect);
            Assert(allocSize);
            Assert(this->uncollectedNewPageCountPartialCollect >= RecyclerSweepManager::MinPartialUncollectedNewPageCount
                && this->uncollectedNewPageCountPartialCollect <= RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount);

            // PARTIAL-GC-REVIEW: For now, we have only alloc size heuristic
            // Maybe improve this heuristic by looking at how many free pages are in the page allocator.
            if (autoHeap.uncollectedNewPageCount > this->uncollectedNewPageCountPartialCollect)
            {
#ifdef ENABLE_JS_ETW
                if (IS_UNKNOWN_GC_TRIGGER(collectionStartReason))
                {
                    collectionStartReason = ETWEventGCActivationTrigger::ETWEvent_GC_Trigger_Partial_GC_AllocSize_Heuristic;
                }
#endif
                return Collect<flags>();
            }
        }
#endif

        // allocation byte count heuristic, collect every 1 MB allocated
        if (allocSize && (autoHeap.uncollectedAllocBytes < RecyclerHeuristic::UncollectedAllocBytesCollection()))
        {
            return FinishDisposeObjectsWrapped<flags>();
        }

        // time heuristic, allocate every 1000 clock tick, or 64 MB is allocated in a short time
        if (timed && (autoHeap.uncollectedAllocBytes < RecyclerHeuristic::Instance.MaxUncollectedAllocBytes))
        {
            uint currentTickCount = GetTickCount();
#ifdef RECYCLER_TRACE
            collectionParam.timeDiff = currentTickCount - tickCountNextCollection;
#endif
            if ((int)(tickCountNextCollection - currentTickCount) >= 0)
            {
                return FinishDisposeObjectsWrapped<flags>();
            }
        }
#ifdef RECYCLER_TRACE
        else
        {
            uint currentTickCount = GetTickCount();
            collectionParam.timeDiff = currentTickCount - tickCountNextCollection;
        }
#endif
    }

    // Passed all the heuristic, do some GC work, maybe
    return Collect<(CollectionFlags)(flags & ~CollectMode_Partial)>();
}